

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testFlatImage.cpp
# Opt level: O0

void anon_unknown.dwarf_9195::fillChannels(Rand48 *random,FlatImage *img)

{
  int iVar1;
  ostream *poVar2;
  long *in_RSI;
  FlatImageLevel *in_stack_00000008;
  Rand48 *in_stack_00000010;
  int x_1;
  int y;
  int x;
  int local_1c;
  int local_18;
  int local_14;
  
  iVar1 = Imf_3_2::Image::levelMode();
  if (iVar1 == 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"        level 0");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    (**(code **)(*in_RSI + 0x18))(in_RSI,0);
    fillChannels(in_stack_00000010,in_stack_00000008);
  }
  else if (iVar1 == 1) {
    for (local_14 = 0; iVar1 = Imf_3_2::Image::numLevels(), local_14 < iVar1;
        local_14 = local_14 + 1) {
      poVar2 = std::operator<<((ostream *)&std::cout,"        level ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_14);
      poVar2 = std::operator<<(poVar2,"");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      (**(code **)(*in_RSI + 0x18))(in_RSI,local_14);
      fillChannels(in_stack_00000010,in_stack_00000008);
    }
  }
  else {
    if (iVar1 != 2) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRUtilTest/testFlatImage.cpp"
                    ,0xf1,"void (anonymous namespace)::fillChannels(Rand48 &, FlatImage &)");
    }
    for (local_18 = 0; iVar1 = Imf_3_2::Image::numYLevels(), local_18 < iVar1;
        local_18 = local_18 + 1) {
      for (local_1c = 0; iVar1 = Imf_3_2::Image::numXLevels(), local_1c < iVar1;
          local_1c = local_1c + 1) {
        poVar2 = std::operator<<((ostream *)&std::cout,"        level (");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_1c);
        poVar2 = std::operator<<(poVar2,", ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_18);
        poVar2 = std::operator<<(poVar2,")");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        (**(code **)(*in_RSI + 0x28))(in_RSI,local_1c,local_18);
        fillChannels(in_stack_00000010,in_stack_00000008);
      }
    }
  }
  return;
}

Assistant:

void
fillChannels (Rand48& random, FlatImage& img)
{
    switch (img.levelMode ())
    {
        case ONE_LEVEL:

            cout << "        level 0" << endl;
            fillChannels (random, img.level ());

            break;

        case MIPMAP_LEVELS:

            for (int x = 0; x < img.numLevels (); ++x)
            {
                cout << "        level " << x << "" << endl;
                fillChannels (random, img.level (x));
            }

            break;

        case RIPMAP_LEVELS:

            for (int y = 0; y < img.numYLevels (); ++y)
            {
                for (int x = 0; x < img.numXLevels (); ++x)
                {
                    cout << "        level (" << x << ", " << y << ")" << endl;
                    fillChannels (random, img.level (x, y));
                }
            }

            break;

        default: assert (false);
    }
}